

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int cmp_objects(Object *first,Object *second)

{
  ObjectType OVar1;
  Object *second_local;
  Object *first_local;
  
  if (first->type == second->type) {
    OVar1 = first->type;
    if (OVar1 == OBJ_STRING) {
      first_local._4_4_ = cmp_strings((ObjString *)first,(ObjString *)second);
    }
    else if ((OVar1 == OBJ_DICT) || (OVar1 == OBJ_LIST)) {
      first_local._4_4_ = 1;
    }
    else {
      first_local._4_4_ = 1;
    }
  }
  else {
    first_local._4_4_ = 1;
  }
  return first_local._4_4_;
}

Assistant:

int cmp_objects(Object *first, Object *second) {
    if (first->type != second->type) {
        return 1;
    }

    switch (first->type) {
        case OBJ_STRING:
            return cmp_strings((ObjString *) first, (ObjString *) second);
        case OBJ_DICT:
            // TODO implement
            break;
        case OBJ_LIST:
            // TODO implement
            break;
        default:
            return 1;
    }

    return 1;
}